

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O1

int arkStep_NlsResidual_MassFixed_TrivialPredAutonomous(N_Vector zcor,N_Vector r,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  int nls_iter;
  N_Vector X [3];
  ARKodeARKStepMem local_60;
  ARKodeMem local_58;
  int local_4c;
  N_Vector local_48;
  N_Vector local_40;
  N_Vector local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  sunrealtype local_18;
  
  iVar1 = arkStep_AccessARKODEStepMem
                    (arkode_mem,"arkStep_NlsResidual_MassFixed_TrivialPredAutonomous",&local_58,
                     &local_60);
  if (iVar1 == 0) {
    N_VLinearSum(0,0,local_60->zpred,zcor,local_58->ycur);
    iVar2 = SUNNonlinSolGetCurIter(local_60->NLS,&local_4c);
    iVar1 = -0x20;
    if (iVar2 == 0) {
      if ((local_4c == 0) && (local_60->fn_implicit != (N_Vector)0x0)) {
        N_VScale(0,local_60->fn_implicit,local_60->Fi[local_60->istage]);
      }
      else {
        iVar1 = (*local_60->nls_fi)(local_58->tcur,local_58->ycur,local_60->Fi[local_60->istage],
                                    local_58->user_data);
        local_60->nfi = local_60->nfi + 1;
        if (iVar1 < 0) {
          return -8;
        }
        if (iVar1 != 0) {
          return 9;
        }
      }
      iVar2 = (*local_60->mmult)(local_58,zcor,r);
      iVar1 = -0x12;
      if (iVar2 == 0) {
        local_28 = 0x3ff0000000000000;
        uStack_20 = 0xbff0000000000000;
        local_40 = local_60->sdata;
        local_18 = -local_60->gamma;
        local_38 = local_60->Fi[local_60->istage];
        local_48 = r;
        iVar2 = N_VLinearCombination(3,&local_28,&local_48,r);
        iVar1 = -0x1c;
        if (iVar2 == 0) {
          iVar1 = 0;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsResidual_MassFixed_TrivialPredAutonomous(N_Vector zcor, N_Vector r,
                                                        void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval, nls_iter;
  sunrealtype c[3];
  N_Vector X[3];

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS if not already available */
  retval = SUNNonlinSolGetCurIter(step_mem->NLS, &nls_iter);
  if (retval != ARK_SUCCESS) { return ARK_NLS_OP_ERR; }

  if (nls_iter == 0 && step_mem->fn_implicit)
  {
    N_VScale(ONE, step_mem->fn_implicit, step_mem->Fi[step_mem->istage]);
  }
  else
  {
    retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                              step_mem->Fi[step_mem->istage], ark_mem->user_data);
    step_mem->nfi++;
    if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
    if (retval > 0) { return (RHSFUNC_RECVR); }
  }

  /* put M*zcor in r */
  retval = step_mem->mmult((void*)ark_mem, zcor, r);
  if (retval != ARK_SUCCESS) { return (ARK_MASSMULT_FAIL); }

  /* compute residual via linear combination */
  c[0]   = ONE;
  X[0]   = r;
  c[1]   = -ONE;
  X[1]   = step_mem->sdata;
  c[2]   = -step_mem->gamma;
  X[2]   = step_mem->Fi[step_mem->istage];
  retval = N_VLinearCombination(3, c, X, r);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }
  return (ARK_SUCCESS);
}